

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cLayoutBindingTests.cpp
# Opt level: O2

String * __thiscall
glcts::AtomicCounterLayoutBindingCase::buildAccess
          (String *__return_storage_ptr__,AtomicCounterLayoutBindingCase *this,String *var)

{
  ostream *poVar1;
  ostringstream s;
  ostringstream local_190 [376];
  
  std::__cxx11::ostringstream::ostringstream(local_190);
  poVar1 = std::operator<<((ostream *)local_190,"vec4(float(atomicCounter(");
  poVar1 = std::operator<<(poVar1,(string *)var);
  std::operator<<(poVar1,")), 1.0, 0.0, 1.0)");
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream(local_190);
  return __return_storage_ptr__;
}

Assistant:

String buildAccess(const String& var)
	{
		std::ostringstream s;
		s << "vec4(float(atomicCounter(" << var << ")), 1.0, 0.0, 1.0)";
		return s.str();
	}